

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O2

MemChunk * __thiscall
cookmem::MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>::
arenaAlloc(MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>
           *this,size_type chunkSize)

{
  MemSegment *pMVar1;
  MemSegment *pMVar2;
  MemChunk *pMVar3;
  ulong uVar4;
  size_type segSize;
  size_type local_18;
  
  local_18 = chunkSize + 0x18;
  if (0xffffffffffffffe7 < chunkSize) {
    return (MemChunk *)0x0;
  }
  if (((this->m_footprintLimit == 0) ||
      (uVar4 = this->m_footprint + local_18,
      uVar4 <= this->m_footprintLimit && this->m_footprint < uVar4)) &&
     (pMVar2 = (MemSegment *)CachedArena<cookmem::MallocArena>::getSegment(this->m_arena,&local_18),
     pMVar2 != (MemSegment *)0x0)) {
    uVar4 = this->m_footprint + local_18;
    this->m_footprint = uVar4;
    if (this->m_maxFootprint < uVar4) {
      this->m_maxFootprint = uVar4;
    }
    pMVar2->m_size = local_18;
    pMVar2->m_pad = 1;
    pMVar2[1].m_size = local_18 - 0x18;
    *(size_type *)((long)pMVar2 + (local_18 - 8)) = local_18 - 0x18;
    pMVar1 = this->m_segList;
    if (pMVar1 == (MemSegment *)0x0) {
      this->m_release_checks = 0xfff;
    }
    this->m_segList = pMVar2;
    pMVar2->m_next = pMVar1;
    pMVar3 = splitChunk(this,(MemChunk *)&pMVar2->m_pad,chunkSize);
    return pMVar3;
  }
  return (MemChunk *)0x0;
}

Assistant:

MemChunk*
    arenaAlloc (size_type chunkSize)
    {
        size_type estSize;             /* allocation size */

        estSize = chunkSize + SEGMENT_OVERHEAD;
        if (estSize <= chunkSize)
        {
            // Technically can never reach here due to the MAX_REQUEST value
            //
            // However it is always good to have a check.
            return nullptr;
        }

        /*
         * Check user specified foot print limit
         */
        if (m_footprintLimit != 0)
        {
            size_type fp = m_footprint + estSize;
            if (fp <= m_footprint || fp > m_footprintLimit)
            {
                return nullptr;
            }
        }

        /*
         * Request memory segments from arena.
         */
        size_type segSize = estSize;
        MemSegment* seg = (MemSegment*)m_arena.getSegment (segSize);
        m_logger.logGetSegment (seg, segSize);

        /*
         * Initialize the segment obtained.
         */
        if (seg)
        {

            if ((m_footprint += segSize) > m_maxFootprint)
            {
                m_maxFootprint = m_footprint;
            }

            MemChunk* chunk = seg->init (segSize);

            if (m_segList == nullptr)
            {
                m_segList = seg;
                seg->setNext (nullptr);

                m_release_checks = MAX_RELEASE_CHECK_RATE;
            }
            else
            {
                seg->setNext (m_segList);
                m_segList = seg;
            }

            return splitChunk (chunk, chunkSize);
        }
        return nullptr;
    }